

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
VW::config::typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::value
          (typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *value)

{
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_20;
  
  std::
  make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_20);
  std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->m_value).
               super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }